

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

bool __thiscall
source::document_iter(source *this,CharContent *uri,Response *response,CharContent *file_path)

{
  int iVar1;
  size_t length;
  char *__name;
  DIR *__dirp;
  bool bVar2;
  dirent *pStResult;
  CharContent res_cont;
  CharContent true_uri;
  dirent pStEntry;
  dirent *local_1a0;
  CharContent local_198;
  CharContent local_170;
  dirent local_148;
  
  CharContent::CharContent((CharContent *)&local_148,"?");
  length = CharContent::find(uri,(CharContent *)&local_148,0);
  CharContent::~CharContent((CharContent *)&local_148);
  CharContent::subCharContent(&local_170,uri,0,length);
  __name = CharContent::c_str(file_path);
  __dirp = opendir(__name);
  local_1a0 = (dirent *)0x0;
  CharContent::CharContent(&local_198);
  CharContent::append(&local_198,"<html><head>file index</head><body>");
  bVar2 = false;
  while( true ) {
    iVar1 = readdir_r(__dirp,&local_148,&local_1a0);
    if ((iVar1 < 0) || (local_1a0 == (dirent *)0x0)) break;
    if (local_148.d_name[0] != '.') {
      CharContent::append(&local_198,"<p><a href=\'");
      CharContent::append(&local_198,&local_170);
      CharContent::append(&local_198,"/");
      CharContent::append(&local_198,local_148.d_name);
      CharContent::append(&local_198,"\'>");
      CharContent::append(&local_198,local_148.d_name);
      bVar2 = true;
      CharContent::append(&local_198,"</a></p>");
    }
  }
  if (!bVar2) {
    CharContent::append(&local_198,"<h1>no content</h1>");
  }
  CharContent::append(&local_198,"</body></html>");
  CharContent::operator=(&response->Entity,&local_198);
  closedir(__dirp);
  CharContent::~CharContent(&local_198);
  CharContent::~CharContent(&local_170);
  return true;
}

Assistant:

bool source::document_iter(CharContent uri,Response *response,CharContent file_path){
	size_t pos=0;
	pos=uri.find("?");
	CharContent true_uri=uri.subCharContent(0,pos);
	DIR *dir_ptr=opendir(file_path.c_str());
	struct dirent *pStResult = NULL;
	struct dirent pStEntry;
	bool get_in=false;
	CharContent res_cont;
	res_cont.append("<html><head>file index</head><body>");
	while(readdir_r(dir_ptr,&pStEntry,&pStResult)>=0&&pStResult!=NULL){
		if(pStEntry.d_name[0]=='.')
			continue;
		get_in=true;
		res_cont.append("<p><a href=\'");
		res_cont.append(true_uri);
		res_cont.append("/");
		res_cont.append(pStEntry.d_name);
		res_cont.append("\'>");
		res_cont.append(pStEntry.d_name);
		res_cont.append("</a></p>");
	}
	if(!get_in)
		res_cont.append("<h1>no content</h1>");
	res_cont.append("</body></html>");
	response->Entity=res_cont;
	closedir(dir_ptr);
	return true;
}